

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

string * __thiscall Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  ThrowPacket *this_00;
  allocator<char> local_49;
  string local_48;
  ptr<Value> local_28;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not cast value to String",&local_49);
  ExceptionObjects::bad_cast((ExceptionObjects *)&local_28,&local_48);
  ThrowPacket::ThrowPacket(this_00,&local_28);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

std::string Value::asString() {
    throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value to String"));
}